

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O2

bool __thiscall
ON_RevSurface::Split
          (ON_RevSurface *this,int dir,double c,ON_Surface **west_or_south_side,
          ON_Surface **east_or_north_side)

{
  ON_BoundingBox *this_00;
  ON_BoundingBox *this_01;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  int iVar7;
  ON_RevSurface *this_02;
  ON_RevSurface *this_03;
  double *pdVar8;
  ON_Curve *pOVar9;
  ON_Curve *pOVar10;
  ON_Surface **ppOVar11;
  ON_Curve *right_side;
  double local_f0;
  ON_Surface **local_e8;
  ON_Curve *local_e0;
  ON_Interval left_t;
  ON_Interval right_angle;
  ON_Interval left_angle;
  ON_BoundingBox input_bbox;
  ON_Interval right_t;
  ON_BoundingBox local_60;
  
  this_02 = Cast((ON_Object *)*west_or_south_side);
  this_03 = Cast((ON_Object *)*east_or_north_side);
  if ((this_02 != (ON_RevSurface *)0x0 && this_02 == this_03) ||
     ((this_02 == (ON_RevSurface *)0x0 && (*west_or_south_side != (ON_Surface *)0x0)))) {
    return false;
  }
  if (1 < (uint)dir) {
    return false;
  }
  if (this_03 == (ON_RevSurface *)0x0 && *east_or_north_side != (ON_Surface *)0x0) {
    return false;
  }
  iVar7 = 1 - dir;
  if (this->m_bTransposed == false) {
    iVar7 = dir;
  }
  local_e0 = (ON_Curve *)0x0;
  right_side = (ON_Curve *)0x0;
  local_e8 = east_or_north_side;
  ON_Interval::ON_Interval(&left_angle);
  ON_Interval::ON_Interval(&right_angle);
  ON_Interval::ON_Interval(&left_t);
  ON_Interval::ON_Interval(&right_t);
  left_angle.m_t[0] = (this->m_angle).m_t[0];
  left_angle.m_t[1] = (this->m_angle).m_t[1];
  right_angle.m_t[0] = (this->m_angle).m_t[0];
  right_angle.m_t[1] = (this->m_angle).m_t[1];
  left_t.m_t[0] = (this->m_t).m_t[0];
  left_t.m_t[1] = (this->m_t).m_t[1];
  right_t.m_t[0] = (this->m_t).m_t[0];
  right_t.m_t[1] = (this->m_t).m_t[1];
  if (iVar7 == 0) {
    local_f0 = ON_Interval::NormalizedParameterAt(&this->m_t,c);
    bVar6 = ON_Interval::Includes(&this->m_t,c,true);
    if (1.0 <= local_f0) {
      return false;
    }
    if (!bVar6) {
      return false;
    }
    if (local_f0 <= 0.0) {
      return false;
    }
    local_f0 = ON_Interval::ParameterAt(&this->m_angle,local_f0);
    bVar6 = ON_Interval::Includes(&this->m_angle,local_f0,true);
    if (!bVar6) {
      return false;
    }
    pdVar8 = ON_Interval::operator[](&left_angle,1);
    *pdVar8 = local_f0;
    pdVar8 = ON_Interval::operator[](&right_angle,0);
    *pdVar8 = local_f0;
    pdVar8 = ON_Interval::operator[](&left_t,1);
    *pdVar8 = c;
    pdVar8 = ON_Interval::operator[](&right_t,0);
    *pdVar8 = c;
    pOVar9 = this->m_curve;
    if (this_02 != this) {
      pOVar9 = ON_Curve::Duplicate(pOVar9);
    }
    ppOVar11 = local_e8;
    pOVar10 = this->m_curve;
    local_e0 = pOVar9;
    if (this_03 != this) {
      pOVar10 = ON_Curve::Duplicate(this->m_curve);
    }
LAB_005ab39e:
    right_side = pOVar10;
    input_bbox.m_min.x._0_4_ = *(undefined4 *)&(this->m_bbox).m_min.x;
    input_bbox.m_min.x._4_4_ = *(undefined4 *)((long)&(this->m_bbox).m_min.x + 4);
    input_bbox.m_min.y._0_4_ = *(undefined4 *)&(this->m_bbox).m_min.y;
    input_bbox.m_min.y._4_4_ = *(undefined4 *)((long)&(this->m_bbox).m_min.y + 4);
    input_bbox.m_min.z._0_4_ = *(undefined4 *)&(this->m_bbox).m_min.z;
    input_bbox.m_min.z._4_4_ = *(undefined4 *)((long)&(this->m_bbox).m_min.z + 4);
    input_bbox.m_max.x._0_4_ = *(undefined4 *)&(this->m_bbox).m_max.x;
    input_bbox.m_max.x._4_4_ = *(undefined4 *)((long)&(this->m_bbox).m_max.x + 4);
    input_bbox.m_max.y._0_4_ = *(undefined4 *)&(this->m_bbox).m_max.y;
    input_bbox.m_max.y._4_4_ = *(undefined4 *)((long)&(this->m_bbox).m_max.y + 4);
    input_bbox.m_max.z._0_4_ = *(undefined4 *)&(this->m_bbox).m_max.z;
    input_bbox.m_max.z._4_4_ = *(undefined4 *)((long)&(this->m_bbox).m_max.z + 4);
    if (this_02 == (ON_RevSurface *)0x0) {
      this_02 = (ON_RevSurface *)operator_new(0xa0);
      ON_RevSurface(this_02);
      *west_or_south_side = (ON_Surface *)this_02;
      goto LAB_005ab3fe;
    }
  }
  else {
    pOVar9 = this->m_curve;
    if (pOVar9 == (ON_Curve *)0x0) {
      return false;
    }
    iVar7 = (*(pOVar9->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3e])
                      (SUB84(c,0),pOVar9,&local_e0,&right_side);
    ppOVar11 = local_e8;
    if ((char)iVar7 == '\0') {
      return false;
    }
    if (this_02 != this) {
      pOVar10 = right_side;
      if (this_03 == this) {
        if (this->m_curve != (ON_Curve *)0x0) {
          (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
        }
        this_03->m_curve = right_side;
        pOVar10 = right_side;
      }
      goto LAB_005ab39e;
    }
    if (this->m_curve != (ON_Curve *)0x0) {
      (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
    }
    this_02->m_curve = local_e0;
    input_bbox.m_min.x._0_4_ = *(undefined4 *)&(this->m_bbox).m_min.x;
    input_bbox.m_min.x._4_4_ = *(undefined4 *)((long)&(this->m_bbox).m_min.x + 4);
    input_bbox.m_min.y._0_4_ = *(undefined4 *)&(this->m_bbox).m_min.y;
    input_bbox.m_min.y._4_4_ = *(undefined4 *)((long)&(this->m_bbox).m_min.y + 4);
    input_bbox.m_min.z._0_4_ = *(undefined4 *)&(this->m_bbox).m_min.z;
    input_bbox.m_min.z._4_4_ = *(undefined4 *)((long)&(this->m_bbox).m_min.z + 4);
    input_bbox.m_max.x._0_4_ = *(undefined4 *)&(this->m_bbox).m_max.x;
    input_bbox.m_max.x._4_4_ = *(undefined4 *)((long)&(this->m_bbox).m_max.x + 4);
    input_bbox.m_max.y._0_4_ = *(undefined4 *)&(this->m_bbox).m_max.y;
    input_bbox.m_max.y._4_4_ = *(undefined4 *)((long)&(this->m_bbox).m_max.y + 4);
    input_bbox.m_max.z._0_4_ = *(undefined4 *)&(this->m_bbox).m_max.z;
    input_bbox.m_max.z._4_4_ = *(undefined4 *)((long)&(this->m_bbox).m_max.z + 4);
  }
  if ((this_02 != this) && (this_02->m_curve != (ON_Curve *)0x0)) {
    (*(this_02->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
    this_02->m_curve = (ON_Curve *)0x0;
  }
LAB_005ab3fe:
  if (this_03 == (ON_RevSurface *)0x0) {
    this_03 = (ON_RevSurface *)operator_new(0xa0);
    ON_RevSurface(this_03);
    *ppOVar11 = (ON_Surface *)this_03;
  }
  if ((this_03 != this) && (this_03->m_curve != (ON_Curve *)0x0)) {
    (*(this_03->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
    this_03->m_curve = (ON_Curve *)0x0;
  }
  dVar1 = (this->m_axis).from.x;
  dVar2 = (this->m_axis).from.y;
  dVar3 = (this->m_axis).from.z;
  dVar4 = (this->m_axis).to.x;
  dVar5 = (this->m_axis).to.z;
  (this_02->m_axis).to.y = (this->m_axis).to.y;
  (this_02->m_axis).to.z = dVar5;
  (this_02->m_axis).from.z = dVar3;
  (this_02->m_axis).to.x = dVar4;
  (this_02->m_axis).from.x = dVar1;
  (this_02->m_axis).from.y = dVar2;
  (this_02->m_angle).m_t[0] = left_angle.m_t[0];
  (this_02->m_angle).m_t[1] = left_angle.m_t[1];
  (this_02->m_t).m_t[0] = left_t.m_t[0];
  (this_02->m_t).m_t[1] = left_t.m_t[1];
  this_02->m_bTransposed = this->m_bTransposed;
  this_02->m_curve = local_e0;
  this_00 = &this_02->m_bbox;
  ON_BoundingBox::Destroy(this_00);
  dVar1 = (this->m_axis).from.x;
  dVar2 = (this->m_axis).from.y;
  dVar3 = (this->m_axis).from.z;
  dVar4 = (this->m_axis).to.x;
  dVar5 = (this->m_axis).to.z;
  (this_03->m_axis).to.y = (this->m_axis).to.y;
  (this_03->m_axis).to.z = dVar5;
  (this_03->m_axis).from.z = dVar3;
  (this_03->m_axis).to.x = dVar4;
  (this_03->m_axis).from.x = dVar1;
  (this_03->m_axis).from.y = dVar2;
  (this_03->m_angle).m_t[0] = right_angle.m_t[0];
  (this_03->m_angle).m_t[1] = right_angle.m_t[1];
  (this_03->m_t).m_t[0] = right_t.m_t[0];
  (this_03->m_t).m_t[1] = right_t.m_t[1];
  this_03->m_bTransposed = this->m_bTransposed;
  this_03->m_curve = right_side;
  this_01 = &this_03->m_bbox;
  ON_BoundingBox::Destroy(this_01);
  ON_Geometry::BoundingBox(&local_60,(ON_Geometry *)this_02);
  bVar6 = ON_BoundingBox::IsValid(this_00);
  if ((bVar6) && (bVar6 = ON_BoundingBox::IsValid(&input_bbox), bVar6)) {
    ON_BoundingBox::Intersection(this_00,&input_bbox);
  }
  ON_Geometry::BoundingBox(&local_60,(ON_Geometry *)this_03);
  bVar6 = ON_BoundingBox::IsValid(this_01);
  if ((bVar6) && (bVar6 = ON_BoundingBox::IsValid(&input_bbox), bVar6)) {
    ON_BoundingBox::Intersection(this_01,&input_bbox);
  }
  return true;
}

Assistant:

bool ON_RevSurface::Split(
       int dir,
       double c,
       ON_Surface*& west_or_south_side,
       ON_Surface*& east_or_north_side
       ) const
{
  bool rc = false;

  ON_RevSurface* srf_ws=ON_RevSurface::Cast(west_or_south_side);
  ON_RevSurface* srf_en=ON_RevSurface::Cast(east_or_north_side);
  if ( srf_ws && srf_ws == srf_en )
    return false;
  if ( west_or_south_side && !srf_ws )
    return false;
  if ( east_or_north_side && !srf_en )
    return false;

  if ( dir != 0 && dir != 1 )
    return false;
  if ( m_bTransposed )
    dir = 1-dir;

  ON_Curve* left_side = 0;
  ON_Curve* right_side = 0;
  ON_Interval left_angle, right_angle;
  ON_Interval left_t, right_t;
  left_angle = m_angle;
  right_angle = m_angle;
  left_t = m_t;
  right_t = m_t;

  if ( dir == 0 )
  {
    double t = m_t.NormalizedParameterAt(c);
    if ( m_t.Includes(c,true) && 0.0 < t && t < 1.0 )
    {
      double a = m_angle.ParameterAt( t );
      if ( m_angle.Includes(a,true) )
      {
        rc = true;

        left_angle[1] = a;
        right_angle[0] = a;
        left_t[1] = c;
        right_t[0] = c;

        if ( srf_ws == this )
          left_side = m_curve;
        else
          left_side = m_curve->Duplicate();
        if ( srf_en == this )
          right_side = m_curve;
        else
          right_side = m_curve->Duplicate();
      }
    }
  }
  else if ( dir == 1 && m_curve )
  {
    rc = m_curve->Split( c, left_side, right_side );
    if ( rc )
    {
      if ( this == srf_ws )
      {
        delete m_curve;
        srf_ws->m_curve = left_side;
      }
      else if ( this == srf_en )
      {
        delete m_curve;
        srf_en->m_curve = right_side;
      }
    }
  }

  if ( rc )
  {
    // save input bounding box
    const ON_BoundingBox input_bbox(m_bbox);

    if ( !srf_ws )
      west_or_south_side = srf_ws = new ON_RevSurface();
    else if ( srf_ws != this && srf_ws->m_curve )
    {
      delete srf_ws->m_curve;
      srf_ws->m_curve = 0;
    }
    if ( !srf_en )
      east_or_north_side = srf_en = new ON_RevSurface();
    if ( srf_en != this && srf_en->m_curve )
    {
      delete srf_en->m_curve;
      srf_en->m_curve = 0;
    }

    srf_ws->m_axis = m_axis;
    srf_ws->m_angle = left_angle;
    srf_ws->m_t = left_t;
    srf_ws->m_bTransposed = m_bTransposed;
    srf_ws->m_curve = left_side;
    srf_ws->m_bbox.Destroy();

    srf_en->m_axis = m_axis;
    srf_en->m_angle = right_angle;
    srf_en->m_t = right_t;
    srf_en->m_bTransposed = m_bTransposed;
    srf_en->m_curve = right_side;
    srf_en->m_bbox.Destroy();

    // update bounding boxes
    // if input box was valid, intersect calculated boxes with
    // input box
    srf_ws->BoundingBox(); // calculates srf_ws->m_bbox
    if ( srf_ws->m_bbox.IsValid() && input_bbox.IsValid() )
      srf_ws->m_bbox.Intersection(input_bbox);

    srf_en->BoundingBox(); // calculates srf_en->m_bbox
    if ( srf_en->m_bbox.IsValid() && input_bbox.IsValid() )
      srf_en->m_bbox.Intersection(input_bbox);
  }

  return rc;
}